

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O0

void pnga_sprs_array_export(Integer s_a,char *file)

{
  int iVar1;
  long lVar2;
  int iVar3;
  void *pvVar4;
  int iVar5;
  char *__dest;
  void *buf;
  char *in_RSI;
  long in_RDI;
  double ival_3;
  double rval_3;
  float ival_2;
  float rval_2;
  int64_t val_7;
  int val_6;
  double val_5;
  float val_4;
  int64_t thi_1;
  int64_t tlo_1;
  int64_t *jdx_1;
  int64_t *idx_1;
  double ival_1;
  double rval_1;
  float ival;
  float rval;
  int64_t val_3;
  int val_2;
  double val_1;
  float val;
  int thi;
  int tlo;
  int *jdx;
  int *idx;
  Integer nblk;
  Integer jhi;
  Integer jlo;
  Integer k;
  Integer j;
  int loffset;
  int ibl;
  Integer itop;
  Integer ioffset;
  Integer istride;
  Integer iihi;
  Integer iilo;
  int64_t nnz;
  int *blksize;
  int *blkoffset;
  int *blkmap;
  Integer total;
  Integer one;
  Integer g_blks;
  int icnt;
  int *istart;
  Integer nblocks;
  Integer iblock;
  Integer iproc;
  Integer nprocs;
  Integer me;
  int *nblock;
  int *ihi;
  int *ilo;
  FILE *SPRS;
  char op [2];
  Integer ld;
  Integer hi;
  Integer lo;
  void *jptr;
  void *iptr;
  void *vptr;
  int idx_size;
  Integer irow;
  Integer nlen_i;
  Integer nlen_j;
  Integer nlen_data;
  int offset;
  char *cptr;
  char frmt [32];
  int local_sync_end;
  int local_sync_begin;
  int type;
  int size;
  Integer hdl;
  char *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  void *in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  Integer in_stack_fffffffffffffde0;
  Integer local_198;
  Integer local_190;
  long local_188;
  int local_178;
  int local_174;
  Integer *local_168;
  long local_160;
  long local_150;
  long local_148;
  void *local_140;
  undefined4 *local_138;
  void *local_130;
  undefined8 local_120;
  long local_100;
  long local_f0;
  Integer local_e8;
  Integer local_e0;
  void *local_d8;
  void *local_d0;
  void *local_c8;
  FILE *local_c0;
  undefined1 local_b2;
  undefined1 local_b1;
  undefined8 local_b0;
  long local_a8;
  long local_a0;
  void *local_98;
  Integer *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff80;
  Integer *in_stack_ffffffffffffff88;
  long in_stack_ffffffffffffff90;
  int local_54;
  char local_48 [32];
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  long local_18;
  char *local_10;
  long local_8;
  
  local_18 = in_RDI + 1000;
  local_1c = (int)SPA[local_18].size;
  local_20 = (int)SPA[local_18].type;
  iVar5 = (int)SPA[local_18].idx_size;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_e0 = pnga_pgroup_nodeid(SPA[local_18].grp);
  local_e8 = pnga_pgroup_nnodes(SPA[local_18].grp);
  iVar3 = _ga_sync_begin;
  local_120 = 1;
  local_24 = _ga_sync_begin;
  local_28 = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (iVar3 != 0) {
    pnga_pgroup_sync((Integer)in_stack_fffffffffffffdc0);
  }
  local_148 = 0;
  for (local_f0 = 0; local_f0 < local_e8; local_f0 = local_f0 + 1) {
    pnga_distribution(ioffset,itop,_loffset,(Integer *)j);
    if (local_148 < local_a8) {
      local_148 = local_a8;
    }
  }
  local_c8 = malloc(local_e8 << 2);
  local_d0 = malloc(local_e8 << 2);
  local_d8 = malloc(local_e8 << 2);
  for (local_f0 = 0; local_f0 < local_e8; local_f0 = local_f0 + 1) {
    *(undefined4 *)((long)local_c8 + local_f0 * 4) = 0;
    *(undefined4 *)((long)local_d0 + local_f0 * 4) = 0;
    *(undefined4 *)((long)local_d8 + local_f0 * 4) = 0;
  }
  *(int *)((long)local_c8 + local_e0 * 4) = (int)SPA[local_18].ilo;
  *(int *)((long)local_d0 + local_e0 * 4) = (int)SPA[local_18].ihi;
  *(int *)((long)local_d8 + local_e0 * 4) = (int)SPA[local_18].nblocks;
  local_b2 = 0x2b;
  local_b1 = 0;
  pnga_pgroup_gop(in_stack_fffffffffffffde0,
                  CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                  in_stack_fffffffffffffdd0,
                  CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                  in_stack_fffffffffffffdc0);
  pnga_pgroup_gop(in_stack_fffffffffffffde0,
                  CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                  in_stack_fffffffffffffdd0,
                  CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                  in_stack_fffffffffffffdc0);
  pnga_pgroup_gop(in_stack_fffffffffffffde0,
                  CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                  in_stack_fffffffffffffdd0,
                  CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                  in_stack_fffffffffffffdc0);
  local_100 = 0;
  local_138 = (undefined4 *)malloc(local_e8 << 2);
  for (local_f0 = 0; local_f0 < local_e8; local_f0 = local_f0 + 1) {
    local_100 = *(int *)((long)local_d8 + local_f0 * 4) + local_100;
  }
  local_130 = malloc(local_100 << 2);
  local_140 = malloc(local_100 << 2);
  *local_138 = 0;
  for (local_f0 = 1; local_f0 < local_e8; local_f0 = local_f0 + 1) {
    local_138[local_f0] = local_138[local_f0 + -1] + *(int *)((long)local_d8 + (local_f0 + -1) * 4);
  }
  for (local_f0 = 0; local_f0 < local_100; local_f0 = local_f0 + 1) {
    *(undefined4 *)((long)local_130 + local_f0 * 4) = 0;
    *(undefined4 *)((long)local_140 + local_f0 * 4) = 0;
  }
  for (local_f0 = 0; local_f0 < *(int *)((long)local_d8 + local_e0 * 4); local_f0 = local_f0 + 1) {
    *(int *)((long)local_130 + (local_f0 + (int)local_138[local_e0]) * 4) =
         (int)SPA[local_18].blkidx[local_f0];
    *(int *)((long)local_140 + (local_f0 + (int)local_138[local_e0]) * 4) =
         (int)SPA[local_18].blksize[local_f0];
  }
  pnga_pgroup_gop(in_stack_fffffffffffffde0,
                  CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                  in_stack_fffffffffffffdd0,
                  CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                  in_stack_fffffffffffffdc0);
  pnga_pgroup_gop(in_stack_fffffffffffffde0,
                  CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                  in_stack_fffffffffffffdd0,
                  CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                  in_stack_fffffffffffffdc0);
  if (iVar5 == 4) {
    strncpy(local_48,"%d %d",5);
    local_54 = 5;
  }
  else {
    strncpy(local_48,"%ld %ld",7);
    local_54 = 7;
  }
  __dest = local_48 + local_54;
  if ((local_20 == 0x3eb) || (local_20 == 0x3ec)) {
    strncpy(__dest," %14.6e",7);
    local_54 = 7;
  }
  else if (local_20 == 0x3e9) {
    strncpy(__dest," %d",3);
    local_54 = 3;
  }
  else if (local_20 == 0x3ea) {
    strncpy(__dest," %ld",4);
    local_54 = 4;
  }
  else if ((local_20 == 0x3ee) || (local_20 == 0x3ef)) {
    strncpy(__dest," %14.6e %14.6e",0xe);
    local_54 = 0xe;
  }
  __dest[local_54] = '\n';
  (__dest + local_54)[1] = '\0';
  if (local_e0 == 0) {
    local_c0 = fopen(local_10,"w");
    fprintf(local_c0,"%%MatrixMarket matrix coordinate real general\n");
    fprintf(local_c0,"%ld %ld %ld\n",SPA[local_18].idim,SPA[local_18].jdim,local_148);
    for (local_f0 = 0; local_f0 < local_e8; local_f0 = local_f0 + 1) {
      local_b0 = 1;
      pnga_distribution(ioffset,itop,_loffset,(Integer *)j);
      buf = malloc(((local_a8 - local_a0) + 1) * (long)local_1c);
      pnga_get(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               (Integer *)CONCAT44(iVar5,in_stack_ffffffffffffff80),buf,in_stack_ffffffffffffff70);
      pnga_distribution(ioffset,itop,_loffset,(Integer *)j);
      in_stack_ffffffffffffff90 = (local_a8 - local_a0) + 1;
      in_stack_ffffffffffffff70 = (Integer *)malloc(in_stack_ffffffffffffff90 * iVar5);
      pnga_get(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               (Integer *)CONCAT44(iVar5,in_stack_ffffffffffffff80),buf,in_stack_ffffffffffffff70);
      pnga_distribution(ioffset,itop,_loffset,(Integer *)j);
      local_98 = malloc(((local_a8 - local_a0) + 1) * (long)iVar5);
      pnga_get(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               (Integer *)CONCAT44(iVar5,in_stack_ffffffffffffff80),buf,in_stack_ffffffffffffff70);
      local_100 = (long)*(int *)((long)local_d8 + local_f0 * 4);
      local_160 = (long)((*(int *)((long)local_d0 + local_f0 * 4) -
                         *(int *)((long)local_c8 + local_f0 * 4)) + 2);
      for (in_stack_ffffffffffffff88 = (Integer *)0x0;
          (long)in_stack_ffffffffffffff88 <
          (long)((*(int *)((long)local_d0 + local_f0 * 4) - *(int *)((long)local_c8 + local_f0 * 4))
                + 1); in_stack_ffffffffffffff88 = (Integer *)((long)in_stack_ffffffffffffff88 + 1))
      {
        local_178 = 0;
        local_150 = (long)in_stack_ffffffffffffff88 + (long)*(int *)((long)local_c8 + local_f0 * 4);
        for (local_174 = 0; local_174 < local_100; local_174 = local_174 + 1) {
          pnga_sprs_array_column_distribution
                    (local_8,(long)*(int *)((long)local_130 +
                                           (long)(local_138[local_f0] + local_174) * 4),&local_190,
                     &local_198);
          pvVar4 = local_98;
          iVar3 = local_178;
          local_168 = (Integer *)(local_174 * local_160 + (long)in_stack_ffffffffffffff88);
          if (iVar5 == 4) {
            iVar1 = *(int *)((long)in_stack_ffffffffffffff70 + (long)local_168 * 4 + 4);
            for (local_188 = (long)*(int *)((long)in_stack_ffffffffffffff70 + (long)local_168 * 4);
                local_188 < iVar1; local_188 = local_188 + 1) {
              if (local_20 == 0x3eb) {
                fprintf(local_c0,local_48,
                        (double)*(float *)((long)buf + (local_188 + local_178) * 4),local_150 + 1,
                        (ulong)(*(int *)((long)pvVar4 + local_188 * 4 + (long)iVar3 * 4) + 1));
              }
              else if (local_20 == 0x3ec) {
                fprintf(local_c0,local_48,*(undefined8 *)((long)buf + (local_188 + local_178) * 8),
                        local_150 + 1,
                        (ulong)(*(int *)((long)pvVar4 + local_188 * 4 + (long)iVar3 * 4) + 1));
              }
              else if (local_20 == 0x3e9) {
                fprintf(local_c0,local_48,local_150 + 1,
                        (ulong)(*(int *)((long)pvVar4 + local_188 * 4 + (long)iVar3 * 4) + 1),
                        (ulong)*(uint *)((long)buf + (local_188 + local_178) * 4));
              }
              else if (local_20 == 0x3ea) {
                fprintf(local_c0,local_48,local_150 + 1,
                        (ulong)(*(int *)((long)pvVar4 + local_188 * 4 + (long)iVar3 * 4) + 1),
                        *(undefined8 *)((long)buf + (local_188 + local_178) * 8));
              }
              else if (local_20 == 0x3ee) {
                fprintf(local_c0,local_48,
                        (double)*(float *)((long)buf + (local_188 * 2 + (long)local_178) * 4),
                        (double)*(float *)((long)buf + (local_188 * 2 + 1 + (long)local_178) * 4),
                        local_150 + 1,
                        (ulong)(*(int *)((long)pvVar4 + local_188 * 4 + (long)iVar3 * 4) + 1));
              }
              else if (local_20 == 0x3ef) {
                fprintf(local_c0,local_48,
                        *(undefined8 *)((long)buf + (local_188 * 2 + (long)local_178) * 8),
                        *(undefined8 *)((long)buf + (local_188 * 2 + 1 + (long)local_178) * 8),
                        local_150 + 1,
                        (ulong)(*(int *)((long)pvVar4 + local_188 * 4 + (long)iVar3 * 4) + 1));
              }
            }
          }
          else {
            lVar2 = in_stack_ffffffffffffff70[(long)local_168 + 1];
            for (local_188 = in_stack_ffffffffffffff70[(long)local_168]; local_188 < lVar2;
                local_188 = local_188 + 1) {
              if (local_20 == 0x3eb) {
                fprintf(local_c0,local_48,
                        (double)*(float *)((long)buf + (local_188 + local_178) * 4),local_150 + 1,
                        *(long *)((long)pvVar4 + local_188 * 8 + (long)iVar3 * 8) + 1);
              }
              else if (local_20 == 0x3ec) {
                fprintf(local_c0,local_48,*(undefined8 *)((long)buf + (local_188 + local_178) * 8),
                        local_150 + 1,*(long *)((long)pvVar4 + local_188 * 8 + (long)iVar3 * 8) + 1)
                ;
              }
              else if (local_20 == 0x3e9) {
                fprintf(local_c0,local_48,local_150 + 1,
                        *(long *)((long)pvVar4 + local_188 * 8 + (long)iVar3 * 8) + 1,
                        (ulong)*(uint *)((long)buf + (local_188 + local_178) * 4));
              }
              else if (local_20 == 0x3ea) {
                fprintf(local_c0,local_48,local_150 + 1,
                        *(long *)((long)pvVar4 + local_188 * 8 + (long)iVar3 * 8) + 1,
                        *(undefined8 *)((long)buf + (local_188 + local_178) * 8));
              }
              else if (local_20 == 0x3ee) {
                fprintf(local_c0,local_48,
                        (double)*(float *)((long)buf + (local_188 * 2 + (long)local_178) * 4),
                        (double)*(float *)((long)buf + (local_188 * 2 + 1 + (long)local_178) * 4),
                        local_150 + 1,*(long *)((long)pvVar4 + local_188 * 8 + (long)iVar3 * 8) + 1)
                ;
              }
              else if (local_20 == 0x3ef) {
                in_stack_fffffffffffffdc0 =
                     *(char **)((long)buf + (local_188 * 2 + (long)local_178) * 8);
                fprintf(local_c0,local_48,in_stack_fffffffffffffdc0,
                        *(undefined8 *)((long)buf + (local_188 * 2 + 1 + (long)local_178) * 8),
                        local_150 + 1,*(long *)((long)pvVar4 + local_188 * 8 + (long)iVar3 * 8) + 1)
                ;
              }
            }
          }
          local_178 = *(int *)((long)local_140 + (long)(local_138[local_f0] + local_174) * 4) +
                      local_178;
        }
      }
      free(buf);
      free(local_98);
      free(in_stack_ffffffffffffff70);
    }
    fclose(local_c0);
  }
  free(local_c8);
  free(local_d0);
  free(local_d8);
  free(local_130);
  free(local_140);
  pnga_pgroup_sync((Integer)in_stack_fffffffffffffdc0);
  return;
}

Assistant:

void pnga_sprs_array_export(Integer s_a, const char* file)
{
  Integer hdl = GA_OFFSET + s_a;
  int size  = SPA[hdl].size;
  int type = SPA[hdl].type;
  int local_sync_begin,local_sync_end;
  char frmt[32];
  char *cptr;
  int offset;
  Integer nlen_data;
  Integer nlen_j;
  Integer nlen_i;
  Integer irow;
  int idx_size = SPA[hdl].idx_size;
  void *vptr;
  void *iptr;
  void *jptr;
  Integer lo, hi, ld;
  char op[2];
  FILE *SPRS;
  int *ilo, *ihi, *nblock;
  Integer me = pnga_pgroup_nodeid(SPA[hdl].grp);
  Integer nprocs = pnga_pgroup_nnodes(SPA[hdl].grp);
  Integer iproc, iblock;
  Integer nblocks;
  int *istart;
  int icnt;
  Integer g_blks;
  Integer one = 1;
  Integer total;
  int *blkmap;
  int *blkoffset;
  int *blksize;
  int64_t nnz;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(SPA[hdl].grp);

  /* find the total number of nonzero elements on each process */
  nnz = 0;
  for (iproc = 0; iproc<nprocs; iproc++) {
    pnga_distribution(SPA[hdl].g_data,iproc,&lo,&hi);
    if (hi > nnz) nnz = hi;
  }

  /* find low and hi row indices on each processor */
  ilo = (int*)malloc(nprocs*sizeof(int));
  ihi = (int*)malloc(nprocs*sizeof(int));
  nblock = (int*)malloc(nprocs*sizeof(int));
  for (iproc=0; iproc<nprocs; iproc++) {
    ilo[iproc] = 0;
    ihi[iproc] = 0;
    nblock[iproc] = 0;
  }
  ilo[me] = (int)SPA[hdl].ilo;
  ihi[me] = (int)SPA[hdl].ihi;
  nblock[me] = (int)SPA[hdl].nblocks;
  op[0] = '+';
  op[1] = '\0';
  pnga_pgroup_gop(SPA[hdl].grp,C_INT,ilo,nprocs,op);
  pnga_pgroup_gop(SPA[hdl].grp,C_INT,ihi,nprocs,op);
  pnga_pgroup_gop(SPA[hdl].grp,C_INT,nblock,nprocs,op);
  /* construct a map of all blocks */
  nblocks = 0;
  blkoffset = (int*)malloc(nprocs*sizeof(int));
  for (iproc=0; iproc<nprocs; iproc++) nblocks += nblock[iproc];
  blkmap = (int*)malloc(nblocks*sizeof(int));
  blksize = (int*)malloc(nblocks*sizeof(int));
  blkoffset[0] = 0;
  for (iproc=1; iproc<nprocs; iproc++) {
    blkoffset[iproc] = blkoffset[iproc-1]+nblock[iproc-1];
  }
  for (iproc=0; iproc<nblocks; iproc++) {
    blkmap[iproc] = 0;
    blksize[iproc] = 0;
  }
  for (iproc=0; iproc<nblock[me]; iproc++) {
    blkmap[iproc+blkoffset[me]] = SPA[hdl].blkidx[iproc];
    blksize[iproc+blkoffset[me]] = SPA[hdl].blksize[iproc];
  }
  pnga_pgroup_gop(SPA[hdl].grp,C_INT,blkmap,nblocks,op);
  pnga_pgroup_gop(SPA[hdl].grp,C_INT,blksize,nblocks,op);
  /* format print statement */
  if (idx_size == 4) {
    strncpy(frmt,"\%d \%d",5);
    offset = 5;
  } else {
    strncpy(frmt,"\%ld \%ld",7);
    offset = 7;
  }
  cptr = frmt+offset;
  if (type == C_FLOAT || type == C_DBL) {
    strncpy(cptr," \%14.6e",7);
    offset = 7;
  } else if (type == C_INT) {
    strncpy(cptr," \%d",3);
    offset = 3;
  } else if (type == C_LONG) {
    strncpy(cptr," \%ld",4);
    offset = 4;
  } else if (type == C_SCPL || type == C_DCPL) {
    strncpy(cptr," \%14.6e \%14.6e",14);
    offset = 14;
  } 
  cptr += offset;
  cptr[0] = '\n';
  cptr++;
  cptr[0] = '\0';

  if (me == 0) {
    /* open file */
    SPRS = fopen(file,"w");
    fprintf(SPRS,"\%\%MatrixMarket matrix coordinate real general\n");
    fprintf(SPRS,"%ld %ld %ld\n",SPA[hdl].idim, SPA[hdl].jdim, nnz);
    /* Loop over all row blocks */
    for (iproc = 0; iproc<nprocs; iproc++) {
      /* find out how much data is on each process, allocate
       * local buffers to hold it and copy data to local buffer */
      /* Copy data from global arrays to local buffers */
      Integer iilo, iihi, istride, ioffset, itop;
      int ibl;
      ld = 1;
      pnga_distribution(SPA[hdl].g_data, iproc, &lo, &hi);
      nlen_data = hi-lo+1;
      vptr = malloc(nlen_data*size);
      pnga_get(SPA[hdl].g_data,&lo,&hi,vptr,&ld);

      pnga_distribution(SPA[hdl].g_i, iproc, &lo, &hi);
      nlen_i = hi-lo+1;
      iptr = malloc(nlen_i*idx_size);
      pnga_get(SPA[hdl].g_i,&lo,&hi,iptr,&ld);

      pnga_distribution(SPA[hdl].g_j, iproc, &lo, &hi);
      nlen_j = hi-lo+1;
      jptr = malloc(nlen_j*idx_size);
      pnga_get(SPA[hdl].g_j,&lo,&hi,jptr,&ld);

      nblocks = nblock[iproc];
      /* loop over rows. Not the most efficient way of printing out information
       * but makes output slightly neater */
      istride = ihi[iproc]-ilo[iproc]+2;
      for (irow = 0; irow<(ihi[iproc]-ilo[iproc]+1); irow++) {
        int loffset = 0;
        iilo = irow+ilo[iproc];
        for (ibl = 0; ibl<nblocks; ibl++) {
          Integer j, k;
          Integer jlo, jhi, nblk;
          nblk = (Integer)blkmap[blkoffset[iproc]+ibl];
          pnga_sprs_array_column_distribution(s_a,nblk,&jlo,&jhi);
          ioffset = ibl*istride+irow;
          if (idx_size == 4) {
            int *idx = (int*)iptr;
            int *jdx = (int*)jptr+loffset;
            int tlo = idx[ioffset];
            int thi = idx[ioffset+1];
            for (k=tlo; k<thi; k++) {
              if (type == C_FLOAT) {
                float val = ((float*)vptr)[k+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,val);
              } else if (type == C_DBL) {
                double val = ((double*)vptr)[k+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,val);
              } else if (type == C_INT) {
                int val = ((int*)vptr)[k+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,val);
              } else if (type == C_LONG) {
                int64_t val = ((int64_t*)vptr)[k+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,val);
              } else if (type == C_SCPL) {
                float rval = ((float*)vptr)[2*k+loffset];
                float ival = ((float*)vptr)[2*k+1+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,rval,ival);
              } else if (type == C_DCPL) {
                double rval = ((double*)vptr)[2*k+loffset];
                double ival = ((double*)vptr)[2*k+1+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,rval,ival);
              }
            }
          } else {
            int64_t *idx = (int64_t*)iptr;
            int64_t *jdx = (int64_t*)jptr+loffset;
            int64_t tlo = idx[ioffset];
            int64_t thi = idx[ioffset+1];
            for (k=tlo; k<thi; k++) {
              if (type == C_FLOAT) {
                float val = ((float*)vptr)[k+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,val);
              } else if (type == C_DBL) {
                double val = ((double*)vptr)[k+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,val);
              } else if (type == C_INT) {
                int val = ((int*)vptr)[k+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,val);
              } else if (type == C_LONG) {
                int64_t val = ((int64_t*)vptr)[k+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,val);
              } else if (type == C_SCPL) {
                float rval = ((float*)vptr)[2*k+loffset];
                float ival = ((float*)vptr)[2*k+1+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,rval,ival);
              } else if (type == C_DCPL) {
                double rval = ((double*)vptr)[2*k+loffset];
                double ival = ((double*)vptr)[2*k+1+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,rval,ival);
              }
            }
          }
          loffset += blksize[blkoffset[iproc]+ibl];
        }
      }
      /* free local buffers */
      free(vptr);
      free(jptr);
      free(iptr);
    }
    fclose(SPRS);
  }
  free(ilo);
  free(ihi);
  free(nblock);
  free(blkmap);
  free(blksize);
  pnga_pgroup_sync(SPA[hdl].grp);
}